

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O0

double __thiscall COLLADABU::Math::Quaternion::exp(Quaternion *this,double __x)

{
  long in_RSI;
  double __x_00;
  double dVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  Real RVar3;
  Real fCoeff;
  Real fSin;
  Real fAngle_radian;
  Quaternion *kResult;
  
  __x_00 = sqrt(*(double *)(in_RSI + 0x18) * *(double *)(in_RSI + 0x18) +
                *(double *)(in_RSI + 8) * *(double *)(in_RSI + 8) +
                *(double *)(in_RSI + 0x10) * *(double *)(in_RSI + 0x10));
  dVar1 = sin(__x_00);
  Quaternion(this,1.0,0.0,0.0,0.0);
  dVar2 = cos(__x_00);
  this->w = dVar2;
  std::abs((int)this);
  if (extraout_XMM0_Qa < 0.001) {
    this->x = *(Real *)(in_RSI + 8);
    this->y = *(Real *)(in_RSI + 0x10);
    RVar3 = *(Real *)(in_RSI + 0x18);
    this->z = RVar3;
  }
  else {
    dVar1 = dVar1 / __x_00;
    this->x = dVar1 * *(double *)(in_RSI + 8);
    this->y = dVar1 * *(double *)(in_RSI + 0x10);
    RVar3 = dVar1 * *(double *)(in_RSI + 0x18);
    this->z = RVar3;
  }
  return RVar3;
}

Assistant:

Quaternion Quaternion::exp () const
        {
            // If q = A*(x*i+y*j+z*k) where (x,y,z) is unit length, then
            // exp(q) = cos(A)+sin(A)*(x*i+y*j+z*k).  If sin(A) is near zero,
            // use exp(q) = cos(A)+A*(x*i+y*j+z*k) since A/sin(A) has limit 1.

            Real fAngle_radian = sqrt( x * x + y * y + z * z );
            Real fSin = sin( fAngle_radian );

            Quaternion kResult;
            kResult.w = cos( fAngle_radian );

            if ( std::abs( fSin ) >= ms_fEpsilon )
            {
                Real fCoeff = fSin / fAngle_radian;
                kResult.x = fCoeff * x;
                kResult.y = fCoeff * y;
                kResult.z = fCoeff * z;
            }

            else
            {
                kResult.x = x;
                kResult.y = y;
                kResult.z = z;
            }

            return kResult;
        }